

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

bool __thiscall
TgBot::Api::restrictChatMember
          (Api *this,int64_t chatId,int32_t userId,uint64_t untilDate,bool canSendMessages,
          bool canSendMediaMessages,bool canSendOtherMessages,bool canAddWebPagePreviews)

{
  type_conflict tVar1;
  bool canAddWebPagePreviews_local;
  bool canSendOtherMessages_local;
  bool canSendMediaMessages_local;
  bool canSendMessages_local;
  bool local_de;
  allocator local_dd;
  int32_t userId_local;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  uint64_t untilDate_local;
  int64_t chatId_local;
  string local_a8;
  ptree local_88;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  canSendOtherMessages_local = canSendOtherMessages;
  canAddWebPagePreviews_local = canAddWebPagePreviews;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  canSendMediaMessages_local = canSendMediaMessages;
  canSendMessages_local = canSendMessages;
  userId_local = userId;
  untilDate_local = untilDate;
  chatId_local = chatId;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve(&args,7);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
             (char (*) [8])0x27334a,&chatId_local);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],int&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
             (char (*) [8])"user_id",&userId_local);
  if (untilDate != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[11],unsigned_long&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [11])"until_date",&untilDate_local);
  }
  if (canSendMessages) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[18],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [18])"can_send_messages",&canSendMessages_local);
  }
  if (canSendMediaMessages) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[24],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [24])"can_send_media_messages",&canSendMediaMessages_local);
  }
  if (canSendOtherMessages) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[24],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [24])"can_send_other_messages",&canSendOtherMessages_local);
  }
  if (canAddWebPagePreviews) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[26],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [26])"can_add_web_page_previews",&canAddWebPagePreviews_local);
  }
  std::__cxx11::string::string((string *)&local_a8,"restrictChatMember",&local_dd);
  sendRequest(&local_88,this,&local_a8,&args);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_60,"",0x2e);
  local_de = false;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(&local_88,&local_60,&local_de);
  std::__cxx11::string::~string((string *)&local_60);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&args);
  return tVar1;
}

Assistant:

bool Api::restrictChatMember(int64_t chatId, int32_t userId, uint64_t untilDate, bool canSendMessages,
                             bool canSendMediaMessages, bool canSendOtherMessages, bool canAddWebPagePreviews) const {
    vector<HttpReqArg> args;
    args.reserve(7);
    args.emplace_back("chat_id", chatId);
    args.emplace_back("user_id", userId);
    if (untilDate) {
        args.emplace_back("until_date", untilDate);
    }
    if (canSendMessages) {
        args.emplace_back("can_send_messages", canSendMessages);
    }
    if (canSendMediaMessages) {
        args.emplace_back("can_send_media_messages", canSendMediaMessages);
    }
    if (canSendOtherMessages) {
        args.emplace_back("can_send_other_messages", canSendOtherMessages);
    }
    if (canAddWebPagePreviews) {
        args.emplace_back("can_add_web_page_previews", canAddWebPagePreviews);
    }
    return sendRequest("restrictChatMember", args).get<bool>("", false);
}